

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall sf::Image::createMaskFromColor(Image *this,Color *color,Uint8 alpha)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  value_type in_DL;
  value_type *in_RSI;
  long in_RDI;
  Uint8 *end;
  Uint8 *ptr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffe0;
  
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    (in_stack_ffffffffffffffe0);
  if (!bVar1) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 8),0);
    pvVar4 = pvVar2;
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 8));
    for (; pvVar4 < pvVar2 + sVar3; pvVar4 = pvVar4 + 4) {
      if ((((*pvVar4 == *in_RSI) && (pvVar4[1] == in_RSI[1])) && (pvVar4[2] == in_RSI[2])) &&
         (pvVar4[3] == in_RSI[3])) {
        pvVar4[3] = in_DL;
      }
    }
  }
  return;
}

Assistant:

void Image::createMaskFromColor(const Color& color, Uint8 alpha)
{
    // Make sure that the image is not empty
    if (!m_pixels.empty())
    {
        // Replace the alpha of the pixels that match the transparent color
        Uint8* ptr = &m_pixels[0];
        Uint8* end = ptr + m_pixels.size();
        while (ptr < end)
        {
            if ((ptr[0] == color.r) && (ptr[1] == color.g) && (ptr[2] == color.b) && (ptr[3] == color.a))
                ptr[3] = alpha;
            ptr += 4;
        }
    }
}